

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O1

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Send
          (IOTHUB_MESSAGING_HANDLE messagingHandle,char *deviceId,IOTHUB_MESSAGE_HANDLE message,
          IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback,void *userContextCallback)

{
  bool bVar1;
  int iVar2;
  IOTHUBMESSAGE_CONTENT_TYPE IVar3;
  IOTHUB_MESSAGE_RESULT IVar4;
  size_t sVar5;
  char *pcVar6;
  LOGGER_LOG p_Var7;
  uchar *__s;
  MESSAGE_HANDLE message_00;
  AMQP_VALUE to_amqp_value;
  SEND_CALLBACK_DATA *send_data;
  ASYNC_OPERATION_HANDLE pAVar8;
  char *pcVar9;
  IOTHUB_MESSAGING_RESULT IVar10;
  BINARY_DATA amqp_data;
  uchar *contentByteArr;
  size_t local_48;
  size_t local_40;
  uchar *local_38;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar6 = "Input parameter messagingHandle cannot be NULL";
    IVar10 = IOTHUB_MESSAGING_INVALID_ARG;
    iVar2 = 0x5a6;
    goto LAB_001484ec;
  }
  if (deviceId == (char *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar6 = "Input parameter deviceId cannot be NULL";
    IVar10 = IOTHUB_MESSAGING_INVALID_ARG;
    iVar2 = 0x5ab;
    goto LAB_001484ec;
  }
  if (message == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar6 = "Input parameter message cannot be NULL";
    IVar10 = IOTHUB_MESSAGING_INVALID_ARG;
    iVar2 = 0x5b0;
    goto LAB_001484ec;
  }
  if (messagingHandle->isOpened == 0) {
    p_Var7 = xlogging_get_log_function();
    IVar10 = IOTHUB_MESSAGING_ERROR;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_ERROR;
    }
    pcVar6 = "Messaging is not opened - call IoTHubMessaging_LL_Open to open";
    iVar2 = 0x5b5;
    goto LAB_001484ec;
  }
  if (messagingHandle->max_send_queue_size <= messagingHandle->send_queue_size) {
    p_Var7 = xlogging_get_log_function();
    IVar10 = IOTHUB_MESSAGING_QUEUE_FULL;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_QUEUE_FULL;
    }
    pcVar6 = "Send queue is full";
    iVar2 = 0x5ba;
    goto LAB_001484ec;
  }
  sVar5 = strlen(deviceId);
  pcVar6 = (char *)malloc(sVar5 + 0x2c);
  if (pcVar6 == (char *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"createDeviceDestinationString",0x28e,1,
                "Could not create device destination string.");
    }
LAB_0014844a:
    pcVar6 = (char *)0x0;
  }
  else {
    iVar2 = snprintf(pcVar6,sVar5 + 0x2c,"/devices/%s/messages/deviceBound",deviceId);
    if (iVar2 < 0) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createDeviceDestinationString",0x295,1,
                  "sprintf_s failed for deviceDestinationString.");
      }
      free(pcVar6);
      goto LAB_0014844a;
    }
  }
  if (pcVar6 == (char *)0x0) {
    p_Var7 = xlogging_get_log_function();
    IVar10 = IOTHUB_MESSAGING_ERROR;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_ERROR;
    }
    pcVar6 = "Could not create a message.";
    iVar2 = 0x5bf;
LAB_001484ec:
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
              ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar6);
    return IVar10;
  }
  IVar3 = IoTHubMessage_GetContentType(message);
  if (IVar3 == IOTHUBMESSAGE_STRING) {
    __s = (uchar *)IoTHubMessage_GetString(message);
    if (__s == (uchar *)0x0) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_001485a7;
      pcVar9 = "Failed getting the STRING representation of the IOTHUB_MESSAGE_HANDLE instance.";
      iVar2 = 0x1b7;
      goto LAB_0014859a;
    }
    local_48 = strlen((char *)__s);
    bVar1 = true;
    local_40 = local_48;
  }
  else if (IVar3 == IOTHUBMESSAGE_BYTEARRAY) {
    IVar4 = IoTHubMessage_GetByteArray(message,&local_38,&local_40);
    if (IVar4 == IOTHUB_MESSAGE_OK) {
      bVar1 = true;
      local_48 = local_40;
      __s = local_38;
    }
    else {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_001485a7;
      pcVar9 = "Failed getting the BYTE array representation of the IOTHUB_MESSAGE_HANDLE instance."
      ;
      iVar2 = 0x1aa;
LAB_0014859a:
      bVar1 = false;
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"getMessageContentAndSize",iVar2,1,pcVar9);
      __s = (uchar *)deviceId;
    }
  }
  else {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      pcVar9 = "Cannot parse IOTHUB_MESSAGE_HANDLE with content type IOTHUBMESSAGE_UNKNOWN.";
      iVar2 = 0x1c3;
      goto LAB_0014859a;
    }
LAB_001485a7:
    bVar1 = false;
    __s = (uchar *)deviceId;
  }
  if (bVar1) {
    message_00 = message_create();
    if (message_00 != (MESSAGE_HANDLE)0x0) {
      to_amqp_value = amqpvalue_create_string(pcVar6);
      if (to_amqp_value == (AMQP_VALUE)0x0) {
        p_Var7 = xlogging_get_log_function();
        IVar10 = IOTHUB_MESSAGING_ERROR;
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"IoTHubMessaging_LL_Send",0x5da,1,
                    "Could not create properties for message - amqpvalue_create_string");
        }
      }
      else {
        amqp_data.length = local_48;
        amqp_data.bytes = __s;
        iVar2 = message_add_body_amqp_data(message_00,amqp_data);
        if (iVar2 == 0) {
          iVar2 = addPropertiesToAMQPMessage(message,message_00,to_amqp_value);
          if (iVar2 != 0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar9 = "Failed setting properties of the uAMQP message.";
              iVar2 = 0x5ec;
              goto LAB_00148726;
            }
            goto LAB_00148731;
          }
          iVar2 = addApplicationPropertiesToAMQPMessage(message,message_00);
          if (iVar2 == 0) {
            send_data = enqueue_send_callback_data
                                  (messagingHandle,sendCompleteCallback,userContextCallback);
            if (send_data == (SEND_CALLBACK_DATA *)0x0) {
              p_Var7 = xlogging_get_log_function();
              IVar10 = IOTHUB_MESSAGING_ERROR;
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar9 = "Failed enqueueing message.";
                iVar2 = 0x5fa;
                goto LAB_00148796;
              }
            }
            else {
              IVar10 = IOTHUB_MESSAGING_OK;
              pAVar8 = messagesender_send_async
                                 (messagingHandle->message_sender,message_00,
                                  IoTHubMessaging_LL_SendMessageComplete,send_data,0);
              if (pAVar8 == (ASYNC_OPERATION_HANDLE)0x0) {
                p_Var7 = xlogging_get_log_function();
                if (p_Var7 != (LOGGER_LOG)0x0) {
                  (*p_Var7)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"IoTHubMessaging_LL_Send",0x5ff,1,"messagesender_send_async failed.");
                }
                dequeue_send_callback_data(send_data);
                IVar10 = IOTHUB_MESSAGING_ERROR;
              }
            }
          }
          else {
            p_Var7 = xlogging_get_log_function();
            IVar10 = IOTHUB_MESSAGING_ERROR;
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar9 = "Failed setting application properties of the uAMQP message.";
              iVar2 = 0x5f1;
LAB_00148796:
              IVar10 = IOTHUB_MESSAGING_ERROR;
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar9);
            }
          }
        }
        else {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed setting the body of the uAMQP message.";
            iVar2 = 0x5e7;
LAB_00148726:
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar9);
          }
LAB_00148731:
          IVar10 = IOTHUB_MESSAGING_ERROR;
        }
        amqpvalue_destroy(to_amqp_value);
      }
      message_destroy(message_00);
      goto LAB_00148745;
    }
    p_Var7 = xlogging_get_log_function();
    IVar10 = IOTHUB_MESSAGING_ERROR;
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00148745;
    pcVar9 = "Could not create a message.";
    iVar2 = 0x5d3;
  }
  else {
    p_Var7 = xlogging_get_log_function();
    IVar10 = IOTHUB_MESSAGING_ERROR;
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00148745;
    pcVar9 = 
    "Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance.";
    iVar2 = 0x5c9;
  }
  IVar10 = IOTHUB_MESSAGING_ERROR;
  (*p_Var7)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
            ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar9);
LAB_00148745:
  free(pcVar6);
  return IVar10;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Send(IOTHUB_MESSAGING_HANDLE messagingHandle, const char* deviceId, IOTHUB_MESSAGE_HANDLE message, IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    // There is no support for module sending message for callers, but most of plumbing is available should this be enabled via a new API.
    const char* moduleId = NULL;

    char* deviceDestinationString;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter messagingHandle cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (deviceId == NULL)
    {
        LogError("Input parameter deviceId cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (message == NULL)
    {
        LogError("Input parameter message cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened == 0)
    {
        LogError("Messaging is not opened - call IoTHubMessaging_LL_Open to open");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else if (is_send_queue_full(messagingHandle))
    {
        LogError("Send queue is full");
        result = IOTHUB_MESSAGING_QUEUE_FULL;
    }
    else if ((deviceDestinationString = createDeviceDestinationString(deviceId, moduleId)) == NULL)
    {
        LogError("Could not create a message.");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else
    {
        unsigned const char* messageContent;
        size_t messageContentSize;

        if (getMessageContentAndSize(message, &messageContent, &messageContentSize) != 0)
        {
            LogError("Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance.");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            MESSAGE_HANDLE amqpMessage;
            AMQP_VALUE to_amqp_value;

            if ((amqpMessage = message_create()) == NULL)
            {
                LogError("Could not create a message.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                if ((to_amqp_value = amqpvalue_create_string(deviceDestinationString)) == NULL)
                {
                    LogError("Could not create properties for message - amqpvalue_create_string");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    BINARY_DATA binary_data;

                    binary_data.bytes = messageContent;
                    binary_data.length = messageContentSize;

                    if (message_add_body_amqp_data(amqpMessage, binary_data) != 0)
                    {
                        
                        LogError("Failed setting the body of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addPropertiesToAMQPMessage(message, amqpMessage, to_amqp_value) != 0)
                    {
                        LogError("Failed setting properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addApplicationPropertiesToAMQPMessage(message, amqpMessage) != 0)
                    {
                        LogError("Failed setting application properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        SEND_CALLBACK_DATA* send_data = enqueue_send_callback_data(messagingHandle, sendCompleteCallback, userContextCallback);

                        if (send_data == NULL)
                        {
                            LogError("Failed enqueueing message.");
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else if (messagesender_send_async(messagingHandle->message_sender, amqpMessage, IoTHubMessaging_LL_SendMessageComplete, send_data, 0) == NULL)
                        {
                            LogError("messagesender_send_async failed.");
                            dequeue_send_callback_data(send_data);
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else
                        {
                            result = IOTHUB_MESSAGING_OK;
                        }
                    }
                    amqpvalue_destroy(to_amqp_value);
                }
                message_destroy(amqpMessage);
            }
        }
        free(deviceDestinationString);
    }
    return result;
}